

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.h
# Opt level: O0

void VP8YuvToRgb565(int y,int u,int v,uint8_t *rgb)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  byte *in_RCX;
  int gb;
  int rg;
  int b;
  int g;
  int r;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  
  iVar1 = VP8YUVToR(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  uVar2 = VP8YUVToG(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  iVar3 = VP8YUVToB(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  *in_RCX = (byte)iVar1 & 0xf8 | (byte)((int)uVar2 >> 5);
  in_RCX[1] = (byte)((uVar2 & 0x1c) << 3) | (byte)(iVar3 >> 3);
  return;
}

Assistant:

static WEBP_INLINE void VP8YuvToRgb565(int y, int u, int v,
                                       uint8_t* const rgb) {
  const int r = VP8YUVToR(y, v);      // 5 usable bits
  const int g = VP8YUVToG(y, u, v);   // 6 usable bits
  const int b = VP8YUVToB(y, u);      // 5 usable bits
  const int rg = (r & 0xf8) | (g >> 5);
  const int gb = ((g << 3) & 0xe0) | (b >> 3);
#if (WEBP_SWAP_16BIT_CSP == 1)
  rgb[0] = gb;
  rgb[1] = rg;
#else
  rgb[0] = rg;
  rgb[1] = gb;
#endif
}